

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_user_agent.cpp
# Opt level: O2

void __thiscall duckdb::PragmaUserAgentData::~PragmaUserAgentData(PragmaUserAgentData *this)

{
  ~PragmaUserAgentData(this);
  operator_delete(this);
  return;
}

Assistant:

PragmaUserAgentData() : finished(false) {
	}